

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printOutputs(PrinterStream *this)

{
  _Optional_payload_base<unsigned_int> _Var1;
  PrinterStream *this_00;
  CodePrinter *pCVar2;
  char *__s;
  pointer arraySize;
  allocator<char> local_c9;
  PrinterStream *local_c8;
  pointer local_c0;
  pointer local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_c0 = (this->module->outputs).
             super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  arraySize = (this->module->outputs).
              super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = this;
  while (arraySize != local_c0) {
    _Var1 = (((_Optional_base<unsigned_int,_true,_true> *)&arraySize->object)->_M_payload).
            super__Optional_payload_base<unsigned_int>;
    local_b8 = arraySize;
    pCVar2 = choc::text::CodePrinter::operator<<(local_c8->out,"output  ");
    nameWithArray_abi_cxx11_
              (&local_90,(PrinterStream *)((long)_Var1 + 0x18),(Identifier *)((long)_Var1 + 0x40),
               (optional<unsigned_int> *)arraySize);
    padded(&local_50,&local_90,0x14);
    pCVar2 = choc::text::CodePrinter::operator<<(pCVar2,&local_50);
    __s = getEndpointTypeName(*(EndpointType *)((long)_Var1 + 0x24));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_c9);
    padded(&local_70,&local_b0,8);
    choc::text::CodePrinter::operator<<(pCVar2,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    this_00 = local_c8;
    printDescription(local_c8,(vector<soul::Type,_std::allocator<soul::Type>_> *)
                              ((long)_Var1 + 0x28));
    printDescription(this_00,(Annotation *)((long)_Var1 + 0x48));
    pCVar2 = choc::text::CodePrinter::operator<<(this_00->out,';');
    choc::text::CodePrinter::startNewLine(pCVar2);
    arraySize = local_b8 + 1;
  }
  return;
}

Assistant:

void printOutputs()
        {
            for (auto io : module.outputs)
            {
                out << "output  "
                    << padded (nameWithArray (io->name, io->arraySize), 20)
                    << padded (getEndpointTypeName (io->endpointType), 8);

                printDescription (io->dataTypes);
                printDescription (io->annotation);
                out << ';' << newLine;
            }
        }